

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::ShaderSourceSplitCase::buildProgram
          (ShaderSourceSplitCase *this,Shader *shader)

{
  TestLog *log;
  RenderContext *renderCtx;
  Shader *vertShader;
  char *__to;
  Shader *fragShader;
  char *__from;
  bool bVar1;
  char *supportShaderSource;
  Program program;
  Shader supportShader;
  
  log = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  renderCtx = ((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx;
  bVar1 = this->m_shaderType != SHADERTYPE_FRAGMENT;
  supportShaderSource = "void main (void) { gl_Position = vec4(0.0); }\n";
  if (bVar1) {
    supportShaderSource = "void main (void) { gl_FragColor = vec4(0.0); }\n";
  }
  glu::Shader::Shader(&supportShader,renderCtx,(uint)bVar1);
  glu::Program::Program(&program,renderCtx);
  glu::Shader::setSources(&supportShader,1,&supportShaderSource,(int *)0x0);
  glu::Shader::compile(&supportShader);
  glu::Program::attachShader(&program,shader->m_shader);
  __from = (char *)(ulong)supportShader.m_shader;
  glu::Program::attachShader(&program,supportShader.m_shader);
  glu::Program::link(&program,__from,__to);
  fragShader = shader;
  vertShader = &supportShader;
  if (this->m_shaderType == SHADERTYPE_VERTEX) {
    fragShader = &supportShader;
    vertShader = shader;
  }
  Functional::anon_unknown_0::logVertexFragmentProgram(log,renderCtx,&program,vertShader,fragShader)
  ;
  glu::Program::~Program(&program);
  glu::Shader::~Shader(&supportShader);
  return;
}

Assistant:

void buildProgram (glu::Shader& shader)
	{
		TestLog&				log					= m_testCtx.getLog();
		glu::RenderContext&		renderCtx			= m_context.getRenderContext();

		const glu::ShaderType	supportShaderType	= (m_shaderType == glu::SHADERTYPE_FRAGMENT ? glu::SHADERTYPE_VERTEX : glu::SHADERTYPE_FRAGMENT);
		const char*				supportShaderSource	= getSimpleShaderSource(supportShaderType);
		glu::Shader				supportShader		(renderCtx, supportShaderType);

		glu::Program			program				(renderCtx);

		supportShader.setSources(1, &supportShaderSource, 0);
		supportShader.compile();

		program.attachShader(shader.getShader());
		program.attachShader(supportShader.getShader());

		program.link();

		if (m_shaderType == glu::SHADERTYPE_VERTEX)
			logVertexFragmentProgram(log, renderCtx, program, shader, supportShader);
		else
			logVertexFragmentProgram(log, renderCtx, program, supportShader, shader);
	}